

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

sexp_conflict
sexp_sendto(sexp_conflict ctx,sexp_conflict self,int sock,void *buffer,size_t len,int flags,
           sockaddr *addr,socklen_t addr_len,sexp_conflict timeout)

{
  ssize_t sVar1;
  int *piVar2;
  void *in_RCX;
  int in_EDX;
  long in_RDI;
  size_t in_R8;
  int in_R9D;
  sockaddr *in_stack_00000008;
  ssize_t res;
  sexp_conflict f;
  sexp_conflict local_8;
  
  sVar1 = sendto(in_EDX,in_RCX,in_R8,in_R9D,in_stack_00000008,(socklen_t)res);
  if (((((sVar1 < 0) && (piVar2 = __errno_location(), *piVar2 == 0xb)) && (f != (sexp_conflict)0x1))
      && (((((ulong)f & 3) != 0 || (f->tag != 0xb)) ||
          (((f->value).flonum != 0.0 || (NAN((f->value).flonum))))))) &&
     (((piVar2 = *(int **)(*(long *)(in_RDI + 0x28) + 0x198), ((ulong)piVar2 & 3) == 0 &&
       (*piVar2 == 0x14)) || ((((ulong)piVar2 & 3) == 0 && (*piVar2 == 0x1b)))))) {
    sexp_apply2(in_RDI,piVar2,(long)in_EDX << 1 | 1,f);
    local_8 = *(sexp_conflict *)(*(long *)(in_RDI + 0x28) + 0x148);
  }
  else {
    local_8 = (sexp_conflict)(sVar1 << 1 | 1);
  }
  return local_8;
}

Assistant:

sexp sexp_sendto (sexp ctx, sexp self, int sock, const void* buffer, size_t len, int flags, struct sockaddr* addr, socklen_t addr_len, sexp timeout) {
#if SEXP_USE_GREEN_THREADS
  sexp f;
#endif
  ssize_t res;
  res = sendto(sock, buffer, len, flags, addr, addr_len);
#if SEXP_USE_GREEN_THREADS
  if (res < 0 && errno == EWOULDBLOCK && !sexp_zerop(timeout)) {
    f = sexp_global(ctx, SEXP_G_THREADS_BLOCKER);
    if (sexp_applicablep(f)) {
      sexp_apply2(ctx, f, sexp_make_fixnum(sock), timeout);
      return sexp_global(ctx, SEXP_G_IO_BLOCK_ONCE_ERROR);
    }
  }
#endif
  return sexp_make_fixnum(res);
}